

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,REF_INT nbin,REF_DBL exp)

{
  REF_INT *pRVar1;
  int local_2c;
  REF_INT ref_malloc_init_i;
  REF_DBL exp_local;
  REF_INT nbin_local;
  REF_HISTOGRAM ref_histogram_local;
  
  ref_histogram->nbin = nbin;
  ref_histogram->exp = exp;
  if (ref_histogram->bins != (REF_INT *)0x0) {
    free(ref_histogram->bins);
  }
  if (ref_histogram->nbin < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x42,"ref_histogram_resolution","malloc ref_histogram->bins of REF_INT negative");
    ref_histogram_local._4_4_ = 1;
  }
  else {
    pRVar1 = (REF_INT *)malloc((long)ref_histogram->nbin << 2);
    ref_histogram->bins = pRVar1;
    if (ref_histogram->bins == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x42,"ref_histogram_resolution","malloc ref_histogram->bins of REF_INT NULL");
      ref_histogram_local._4_4_ = 2;
    }
    else {
      for (local_2c = 0; local_2c < ref_histogram->nbin; local_2c = local_2c + 1) {
        ref_histogram->bins[local_2c] = 0;
      }
      ref_histogram_local._4_4_ = 0;
    }
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,
                                            REF_INT nbin, REF_DBL exp) {
  ref_histogram_nbin(ref_histogram) = nbin;
  ref_histogram_exp(ref_histogram) = exp;

  ref_free(ref_histogram->bins);
  ref_malloc_init(ref_histogram->bins, ref_histogram_nbin(ref_histogram),
                  REF_INT, 0);

  return REF_SUCCESS;
}